

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult
               (ostream *stream,TestResult *result)

{
  ostream *poVar1;
  TestResult *in_RSI;
  TestResult *in_RDI;
  allocator<char> *in_stack_fffffffffffff5a0;
  TestResult *pTVar2;
  char *in_stack_fffffffffffff5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5b0;
  undefined8 in_stack_fffffffffffff658;
  undefined1 uVar3;
  string *in_stack_fffffffffffff660;
  string *indent;
  string *in_stack_fffffffffffff668;
  TestResult *result_00;
  string *in_stack_fffffffffffff670;
  string *name;
  string *in_stack_fffffffffffff678;
  ostream *in_stack_fffffffffffff680;
  string *stream_00;
  TestResult *in_stack_fffffffffffff708;
  ostream *in_stack_fffffffffffff710;
  allocator<char> *in_stack_fffffffffffff728;
  string local_868 [32];
  string local_848 [32];
  string local_828 [16];
  TimeInMillis in_stack_fffffffffffff7e8;
  string local_808 [32];
  string local_7e8 [39];
  allocator<char> local_7c1;
  string local_7c0 [39];
  allocator<char> local_799;
  string local_798 [39];
  allocator<char> local_771;
  string local_770 [32];
  string local_750 [32];
  string local_730 [39];
  allocator<char> local_709;
  string local_708 [39];
  allocator<char> local_6e1;
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [39];
  allocator<char> local_679;
  string local_678 [39];
  allocator<char> local_651;
  string local_650 [32];
  string local_630 [39];
  allocator<char> local_609;
  string local_608 [39];
  allocator<char> local_5e1;
  string local_5e0 [39];
  allocator<char> local_5b9;
  string local_5b8 [32];
  string local_598 [39];
  allocator<char> local_571;
  string local_570 [39];
  allocator<char> local_549;
  string local_548 [39];
  allocator<char> local_521;
  string local_520 [32];
  string local_500 [39];
  allocator<char> local_4d9;
  string local_4d8 [39];
  undefined1 local_4b1 [40];
  undefined1 local_489 [33];
  string local_468 [32];
  string local_448 [32];
  string local_428 [32];
  string local_408 [39];
  allocator<char> local_3e1;
  string local_3e0 [39];
  allocator<char> local_3b9;
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [39];
  allocator<char> local_351;
  string local_350 [39];
  allocator<char> local_329;
  string local_328 [32];
  string local_308 [39];
  allocator<char> local_2e1;
  string local_2e0 [39];
  allocator<char> local_2b9;
  string local_2b8 [32];
  string local_298 [39];
  allocator<char> local_271;
  string local_270 [39];
  ostream local_249;
  string local_248 [32];
  string local_228 [39];
  allocator<char> local_201;
  string local_200 [39];
  allocator<char> local_1d9;
  string local_1d8 [32];
  string local_1b8 [39];
  allocator<char> local_191;
  string local_190 [39];
  allocator<char> local_169;
  string local_168 [32];
  string local_148 [39];
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [32];
  string local_d8 [39];
  allocator<char> local_b1;
  string local_b0 [39];
  allocator<char> local_89;
  string local_88 [39];
  allocator<char> local_61;
  string local_60 [48];
  string local_30 [32];
  TestResult *local_10;
  TestResult *local_8;
  
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffff658 >> 0x38);
  local_10 = in_RSI;
  local_8 = in_RDI;
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
  poVar1 = std::operator<<((ostream *)in_RDI,local_30);
  std::operator<<(poVar1,"{\n");
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
  OutputJsonKey(in_stack_fffffffffffff680,in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                in_stack_fffffffffffff668,in_stack_fffffffffffff660,(bool)uVar3);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator(&local_b1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
  OutputJsonKey(in_stack_fffffffffffff680,in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                (int)((ulong)in_stack_fffffffffffff668 >> 0x20),in_stack_fffffffffffff660,
                (bool)uVar3);
  std::__cxx11::string::~string(local_148);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator(&local_121);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
    OutputJsonKey(in_stack_fffffffffffff680,in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                  (int)((ulong)in_stack_fffffffffffff668 >> 0x20),in_stack_fffffffffffff660,
                  (bool)uVar3);
    std::__cxx11::string::~string(local_1b8);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator(&local_191);
    std::__cxx11::string::~string(local_168);
    std::allocator<char>::~allocator(&local_169);
    in_stack_fffffffffffff728 = &local_1d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
    OutputJsonKey(in_stack_fffffffffffff680,in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                  (int)((ulong)in_stack_fffffffffffff668 >> 0x20),in_stack_fffffffffffff660,
                  (bool)uVar3);
    std::__cxx11::string::~string(local_228);
    std::__cxx11::string::~string(local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string(local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    in_stack_fffffffffffff710 = &local_249;
    in_stack_fffffffffffff708 = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
    OutputJsonKey(in_stack_fffffffffffff680,in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                  (int)((ulong)in_stack_fffffffffffff668 >> 0x20),in_stack_fffffffffffff660,
                  (bool)uVar3);
    std::__cxx11::string::~string(local_298);
    std::__cxx11::string::~string(local_270);
    std::allocator<char>::~allocator(&local_271);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator((allocator<char> *)&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
    OutputJsonKey(in_stack_fffffffffffff680,in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                  (int)((ulong)in_stack_fffffffffffff668 >> 0x20),in_stack_fffffffffffff660,
                  (bool)uVar3);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::~string(local_2e0);
    std::allocator<char>::~allocator(&local_2e1);
    std::__cxx11::string::~string(local_2b8);
    std::allocator<char>::~allocator(&local_2b9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    TestResult::elapsed_time(local_10);
    FormatTimeInMillisAsDuration_abi_cxx11_((TimeInMillis)in_stack_fffffffffffff728);
    Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
    OutputJsonKey(in_stack_fffffffffffff680,in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                  in_stack_fffffffffffff668,in_stack_fffffffffffff660,(bool)uVar3);
    std::__cxx11::string::~string(local_398);
    std::__cxx11::string::~string(local_378);
    std::__cxx11::string::~string(local_350);
    std::allocator<char>::~allocator(&local_351);
    std::__cxx11::string::~string(local_328);
    std::allocator<char>::~allocator(&local_329);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
    TestResult::start_timestamp(local_10);
    FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(in_stack_fffffffffffff7e8);
    Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
    OutputJsonKey(in_stack_fffffffffffff680,in_stack_fffffffffffff678,in_stack_fffffffffffff670,
                  in_stack_fffffffffffff668,in_stack_fffffffffffff660,(bool)uVar3);
    std::__cxx11::string::~string(local_428);
    std::__cxx11::string::~string(local_408);
    std::__cxx11::string::~string(local_3e0);
    std::allocator<char>::~allocator(&local_3e1);
    std::__cxx11::string::~string(local_3b8);
    std::allocator<char>::~allocator(&local_3b9);
  }
  pTVar2 = local_8;
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
  poVar1 = std::operator<<((ostream *)pTVar2,local_448);
  std::operator<<(poVar1,"\"testsuite\": [\n");
  std::__cxx11::string::~string(local_448);
  stream_00 = local_468;
  pTVar2 = local_8;
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
  poVar1 = std::operator<<((ostream *)pTVar2,stream_00);
  std::operator<<(poVar1,"{\n");
  std::__cxx11::string::~string(local_468);
  name = (string *)local_489;
  result_00 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  indent = (string *)local_4b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  uVar3 = (undefined1)((ulong)&local_4d9 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
  OutputJsonKey((ostream *)stream_00,(string *)pTVar2,name,(string *)result_00,indent,(bool)uVar3);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::~string(local_4d8);
  std::allocator<char>::~allocator(&local_4d9);
  std::__cxx11::string::~string((string *)(local_4b1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_4b1);
  std::__cxx11::string::~string((string *)(local_489 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_489);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
  OutputJsonKey((ostream *)stream_00,(string *)pTVar2,name,(string *)result_00,indent,(bool)uVar3);
  std::__cxx11::string::~string(local_598);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator(&local_571);
  std::__cxx11::string::~string(local_548);
  std::allocator<char>::~allocator(&local_549);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::~allocator(&local_521);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
  OutputJsonKey((ostream *)stream_00,(string *)pTVar2,name,(string *)result_00,indent,(bool)uVar3);
  std::__cxx11::string::~string(local_630);
  std::__cxx11::string::~string(local_608);
  std::allocator<char>::~allocator(&local_609);
  std::__cxx11::string::~string(local_5e0);
  std::allocator<char>::~allocator(&local_5e1);
  std::__cxx11::string::~string(local_5b8);
  std::allocator<char>::~allocator(&local_5b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  TestResult::start_timestamp(local_10);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_(in_stack_fffffffffffff7e8);
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
  OutputJsonKey((ostream *)stream_00,(string *)pTVar2,name,(string *)result_00,indent,(bool)uVar3);
  std::__cxx11::string::~string(local_6c0);
  std::__cxx11::string::~string(local_6a0);
  std::__cxx11::string::~string(local_678);
  std::allocator<char>::~allocator(&local_679);
  std::__cxx11::string::~string(local_650);
  std::allocator<char>::~allocator(&local_651);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  TestResult::elapsed_time(local_10);
  FormatTimeInMillisAsDuration_abi_cxx11_((TimeInMillis)in_stack_fffffffffffff728);
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
  OutputJsonKey((ostream *)stream_00,(string *)pTVar2,name,(string *)result_00,indent,(bool)uVar3);
  std::__cxx11::string::~string(local_750);
  std::__cxx11::string::~string(local_730);
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator(&local_709);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator(&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff5b0,in_stack_fffffffffffff5a8,in_stack_fffffffffffff5a0);
  Indent_abi_cxx11_((size_t)in_stack_fffffffffffff5a8);
  OutputJsonKey((ostream *)stream_00,(string *)pTVar2,name,(string *)result_00,indent,(bool)uVar3);
  std::__cxx11::string::~string(local_7e8);
  std::__cxx11::string::~string(local_7c0);
  std::allocator<char>::~allocator(&local_7c1);
  std::__cxx11::string::~string(local_798);
  std::allocator<char>::~allocator(&local_799);
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator(&local_771);
  pTVar2 = local_8;
  Indent_abi_cxx11_((size_t)local_10);
  TestPropertiesAsJson(result_00,indent);
  std::operator<<((ostream *)pTVar2,local_808);
  std::__cxx11::string::~string(local_808);
  std::__cxx11::string::~string(local_828);
  OutputJsonTestResult(in_stack_fffffffffffff710,in_stack_fffffffffffff708);
  poVar1 = std::operator<<((ostream *)local_8,"\n");
  Indent_abi_cxx11_((size_t)local_10);
  poVar1 = std::operator<<(poVar1,local_848);
  poVar1 = std::operator<<(poVar1,"]\n");
  Indent_abi_cxx11_((size_t)local_10);
  poVar1 = std::operator<<(poVar1,local_868);
  std::operator<<(poVar1,"}");
  std::__cxx11::string::~string(local_868);
  std::__cxx11::string::~string(local_848);
  return;
}

Assistant:

void JsonUnitTestResultPrinter::OutputJsonTestSuiteForTestResult(
    ::std::ostream* stream, const TestResult& result) {
  // Output the boilerplate for a new test suite.
  *stream << Indent(4) << "{\n";
  OutputJsonKey(stream, "testsuite", "name", "NonTestSuiteFailure", Indent(6));
  OutputJsonKey(stream, "testsuite", "tests", 1, Indent(6));
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputJsonKey(stream, "testsuite", "failures", 1, Indent(6));
    OutputJsonKey(stream, "testsuite", "disabled", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "skipped", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "errors", 0, Indent(6));
    OutputJsonKey(stream, "testsuite", "time",
                  FormatTimeInMillisAsDuration(result.elapsed_time()),
                  Indent(6));
    OutputJsonKey(stream, "testsuite", "timestamp",
                  FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                  Indent(6));
  }
  *stream << Indent(6) << "\"testsuite\": [\n";

  // Output the boilerplate for a new test case.
  *stream << Indent(8) << "{\n";
  OutputJsonKey(stream, "testcase", "name", "", Indent(10));
  OutputJsonKey(stream, "testcase", "status", "RUN", Indent(10));
  OutputJsonKey(stream, "testcase", "result", "COMPLETED", Indent(10));
  OutputJsonKey(stream, "testcase", "timestamp",
                FormatEpochTimeInMillisAsRFC3339(result.start_timestamp()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "time",
                FormatTimeInMillisAsDuration(result.elapsed_time()),
                Indent(10));
  OutputJsonKey(stream, "testcase", "classname", "", Indent(10), false);
  *stream << TestPropertiesAsJson(result, Indent(10));

  // Output the actual test result.
  OutputJsonTestResult(stream, result);

  // Finish the test suite.
  *stream << "\n" << Indent(6) << "]\n" << Indent(4) << "}";
}